

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>_>
::MapSorterPtr(MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>_>
               *this,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
                     *m)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  type ppvVar6;
  type ppvVar7;
  void **local_a8;
  value_type *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
  *__range3;
  type local_38;
  storage_type *it;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
  *m_local;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>_>
  *this_local;
  
  sVar3 = UntypedMapBase::size((UntypedMapBase *)m);
  this->size_ = sVar3;
  if (this->size_ == 0) {
    local_a8 = (void **)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->size_;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_a8 = (void **)operator_new__(uVar4);
  }
  std::unique_ptr<void_const*[],std::default_delete<void_const*[]>>::
  unique_ptr<void_const**,std::default_delete<void_const*[]>,void,bool>
            ((unique_ptr<void_const*[],std::default_delete<void_const*[]>> *)&this->items_,local_a8)
  ;
  if (this->size_ != 0) {
    local_38 = std::unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_>::operator[]
                         (&this->items_,0);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
    ::begin((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,m);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
    ::end((const_iterator *)&entry,m);
    while (bVar2 = protobuf::operator!=
                             ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                              (const_iterator *)&entry), bVar2) {
      pvVar5 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
               ::const_iterator::operator*
                         ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
      *local_38 = pvVar5;
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnum>
      ::const_iterator::operator++((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_)
      ;
      local_38 = local_38 + 1;
    }
    ppvVar6 = std::unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_>::operator[]
                        (&this->items_,0);
    ppvVar7 = std::unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_>::operator[]
                        (&this->items_,this->size_);
    std::sort<void_const**,google::protobuf::internal::MapSorterPtrLessThan<std::__cxx11::string>>
              (ppvVar6,ppvVar7);
  }
  return;
}

Assistant:

explicit MapSorterPtr(const MapT& m)
      : size_(m.size()), items_(size_ ? new storage_type[size_] : nullptr) {
    if (!size_) return;
    storage_type* it = &items_[0];
    for (const auto& entry : m) {
      *it++ = &entry;
    }
    static_assert(PROTOBUF_FIELD_OFFSET(typename MapT::value_type, first) == 0,
                  "Must hold for MapSorterPtrLessThan to work.");
    std::sort(&items_[0], &items_[size_],
              MapSorterPtrLessThan<typename MapT::key_type>{});
  }